

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

stbtt__buf stbtt__cff_index_get(stbtt__buf b,int i)

{
  stbtt_uint32 sVar1;
  stbtt_uint32 sVar2;
  stbtt_uint32 sVar3;
  long lVar4;
  byte bVar5;
  stbtt__buf sVar6;
  stbtt__buf b_local;
  
  b_local._8_8_ = b._8_8_;
  b_local.data = b.data;
  bVar5 = 0;
  stbtt__buf_seek(&b_local,0);
  sVar1 = stbtt__buf_get(&b_local,2);
  lVar4 = (long)b_local.cursor;
  if (b_local.cursor < b_local.size) {
    b_local.cursor = b_local.cursor + 1;
    bVar5 = b_local.data[lVar4];
  }
  if ((-1 < i) && (i < (int)sVar1)) {
    if ((byte)(bVar5 - 1) < 4) {
      stbtt__buf_skip(&b_local,i * (uint)bVar5);
      sVar2 = stbtt__buf_get(&b_local,(uint)bVar5);
      sVar3 = stbtt__buf_get(&b_local,(uint)bVar5);
      sVar6 = stbtt__buf_range(&b_local,(sVar1 + 1) * (uint)bVar5 + sVar2 + 2,sVar3 - sVar2);
      return sVar6;
    }
    __assert_fail("offsize >= 1 && offsize <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imstb_truetype.h"
                  ,0x4e2,"stbtt__buf stbtt__cff_index_get(stbtt__buf, int)");
  }
  __assert_fail("i >= 0 && i < count",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imstb_truetype.h"
                ,0x4e1,"stbtt__buf stbtt__cff_index_get(stbtt__buf, int)");
}

Assistant:

static stbtt__buf stbtt__cff_index_get(stbtt__buf b, int i)
{
   int count, offsize, start, end;
   stbtt__buf_seek(&b, 0);
   count = stbtt__buf_get16(&b);
   offsize = stbtt__buf_get8(&b);
   STBTT_assert(i >= 0 && i < count);
   STBTT_assert(offsize >= 1 && offsize <= 4);
   stbtt__buf_skip(&b, i*offsize);
   start = stbtt__buf_get(&b, offsize);
   end = stbtt__buf_get(&b, offsize);
   return stbtt__buf_range(&b, 2+(count+1)*offsize+start, end - start);
}